

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_SetConstructorBit(JSContext *ctx,JSValue func_obj,BOOL val)

{
  bool bVar1;
  
  bVar1 = (int)func_obj.tag == -1;
  if (bVar1) {
    *(byte *)((long)func_obj.u.ptr + 5) =
         *(byte *)((long)func_obj.u.ptr + 5) & 0xef | ((byte)val & 1) << 4;
  }
  return (uint)bVar1;
}

Assistant:

BOOL JS_SetConstructorBit(JSContext *ctx, JSValueConst func_obj, BOOL val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT)
        return FALSE;
    p = JS_VALUE_GET_OBJ(func_obj);
    p->is_constructor = val;
    return TRUE;
}